

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InterfacePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InterfacePortHeaderSyntax,slang::parsing::Token&,slang::syntax::DotMemberClauseSyntax*&>
          (BumpAllocator *this,Token *args,DotMemberClauseSyntax **args_1)

{
  DotMemberClauseSyntax *pDVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  InterfacePortHeaderSyntax *pIVar7;
  
  pIVar7 = (InterfacePortHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InterfacePortHeaderSyntax *)this->endPtr < pIVar7 + 1) {
    pIVar7 = (InterfacePortHeaderSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pIVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pDVar1 = *args_1;
  (pIVar7->super_PortHeaderSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar7->super_PortHeaderSyntax).super_SyntaxNode.kind = InterfacePortHeader;
  (pIVar7->nameOrKeyword).kind = TVar3;
  (pIVar7->nameOrKeyword).field_0x2 = uVar4;
  (pIVar7->nameOrKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pIVar7->nameOrKeyword).rawLen = uVar6;
  (pIVar7->nameOrKeyword).info = pIVar2;
  pIVar7->modport = pDVar1;
  if (pDVar1 != (DotMemberClauseSyntax *)0x0) {
    (pDVar1->super_SyntaxNode).parent = (SyntaxNode *)pIVar7;
  }
  return pIVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }